

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O0

void __thiscall fasttext::QMatrix::save(QMatrix *this,ostream *out)

{
  uchar *puVar1;
  ProductQuantizer *in_RSI;
  ostream *in_RDI;
  ProductQuantizer *this_00;
  ProductQuantizer *this_01;
  
  std::ostream::write((char *)in_RSI,(long)(in_RDI + 0x40));
  std::ostream::write((char *)in_RSI,(long)(in_RDI + 0x48));
  std::ostream::write((char *)in_RSI,(long)(in_RDI + 0x50));
  std::ostream::write((char *)in_RSI,(long)(in_RDI + 0x58));
  this_00 = in_RSI;
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19b8cb);
  std::ostream::write((char *)in_RSI,(long)puVar1);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
              *)0x19b8ef);
  ProductQuantizer::save(this_00,in_RDI);
  if (((byte)in_RDI[0x40] & 1) != 0) {
    this_01 = this_00;
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19b91e);
    std::ostream::write((char *)this_00,(long)puVar1);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                *)0x19b945);
    ProductQuantizer::save(this_01,in_RDI);
  }
  return;
}

Assistant:

void QMatrix::save(std::ostream& out) {
  out.write((char*)&qnorm_, sizeof(qnorm_));
  out.write((char*)&m_, sizeof(m_));
  out.write((char*)&n_, sizeof(n_));
  out.write((char*)&codesize_, sizeof(codesize_));
  out.write((char*)codes_.data(), codesize_ * sizeof(uint8_t));
  pq_->save(out);
  if (qnorm_) {
    out.write((char*)norm_codes_.data(), m_ * sizeof(uint8_t));
    npq_->save(out);
  }
}